

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peer.hxx
# Opt level: O1

void __thiscall cornerstone::peer::set_snapshot_in_sync(peer *this,ptr<snapshot> *s)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  snapshot_sync_ctx *psVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined1 local_29;
  snapshot_sync_ctx *local_28;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_20 [2];
  
  if ((s->super___shared_ptr<cornerstone::snapshot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr ==
      (element_type *)0x0) {
    p_Var1 = (this->snp_sync_ctx_).
             super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->snp_sync_ctx_).
    super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->snp_sync_ctx_).
    super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      return;
    }
  }
  else {
    local_28 = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<cornerstone::snapshot_sync_ctx,std::allocator<cornerstone::snapshot_sync_ctx>,std::shared_ptr<cornerstone::snapshot>const&>
              (a_Stack_20,&local_28,(allocator<cornerstone::snapshot_sync_ctx> *)&local_29,s);
    _Var3._M_pi = a_Stack_20[0]._M_pi;
    psVar2 = local_28;
    local_28 = (snapshot_sync_ctx *)0x0;
    a_Stack_20[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->snp_sync_ctx_).
             super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    (this->snp_sync_ctx_).
    super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_ptr = psVar2;
    (this->snp_sync_ctx_).
    super___shared_ptr<cornerstone::snapshot_sync_ctx,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Var3._M_pi;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (a_Stack_20[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_20[0]._M_pi);
    }
  }
  return;
}

Assistant:

void set_snapshot_in_sync(const ptr<snapshot>& s)
    {
        if (s == nilptr)
        {
            snp_sync_ctx_.reset();
        }
        else
        {
            snp_sync_ctx_ = cs_new<snapshot_sync_ctx>(s);
        }
    }